

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O2

Matrix * __thiscall
ANN::feed_forward(Matrix *__return_storage_ptr__,ANN *this,
                 vector<double,_std::allocator<double>_> *inputs)

{
  pointer pLVar1;
  vector<double,_std::allocator<double>_> *inputs_00;
  long lVar2;
  uint uVar3;
  uint uVar4;
  Matrix mat;
  Matrix local_90;
  Matrix local_70;
  Matrix local_50;
  
  mat.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mat.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mat.m_vals.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Layer::equalize((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                  super__Vector_impl_data._M_start,inputs);
  uVar3 = 0;
  while( true ) {
    uVar4 = uVar3 + 1;
    pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = (long)(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pLVar1;
    if ((ulong)(lVar2 / 0x58) <= (ulong)uVar4) break;
    Layer::outputs(&local_90,pLVar1 + uVar3);
    Matrix::transpose(&local_70,
                      &(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar3].m_weights);
    Matrix::operator*(&local_50,&local_90,&local_70);
    Matrix::operator=(&mat,&local_50);
    Matrix::~Matrix(&local_50);
    Matrix::~Matrix(&local_70);
    Matrix::~Matrix(&local_90);
    Matrix::operator+=(&mat,&(this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar3].m_biases);
    pLVar1 = (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    inputs_00 = Matrix::operator[](&mat,0);
    Layer::equalize(pLVar1 + uVar4,inputs_00);
    uVar3 = uVar4;
  }
  Layer::outputs(__return_storage_ptr__,(Layer *)((long)pLVar1 + lVar2 + -0x58));
  Matrix::~Matrix(&mat);
  return __return_storage_ptr__;
}

Assistant:

Matrix ANN::feed_forward(const std::vector<double>& inputs){
    Matrix mat;
    m_layers[0].equalize(inputs);

    for(uint i=1;i<m_layers.size();++i){
        mat=m_layers[i-1].outputs()*Matrix::transpose(m_layers[i-1].weights());
        mat+=m_layers[i-1].biases();
        m_layers[i].equalize(mat[0]);
    }

    return m_layers[m_layers.size()-1].outputs();
}